

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04a.cpp
# Opt level: O3

void day4a::run(void)

{
  int iVar1;
  ostream *poVar2;
  string input;
  char local_29;
  string local_28;
  
  read_file_abi_cxx11_(&local_28,"input/day4.txt");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"day4a ",6);
  iVar1 = sum_of_real_rooms(&local_28);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  local_29 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void run() {
		std::string input = read_file("input/day4.txt");
		std::cout << "day4a ";
		std::cout << sum_of_real_rooms(input) << '\n';
		//std::cout << sum_of_real_rooms("aaaaa-bbb-z-y-x-123[abxyz]\na-b-c-d-e-f-g-h-987[abcde]\nnot-a-real-room-404[oarel]\ntotally-real-room-200[decoy]") << '\n';
	}